

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_MaterialRef::Read(ON_MaterialRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  object_material_source oVar3;
  int minor_version;
  int major_version;
  ON_SimpleArray<ON_MappingChannel> obsolete_mapping_channels;
  uint local_3c;
  int local_38;
  int local_34;
  ON_SimpleArray<ON_MappingChannel> local_30;
  
  (this->m_material_backface_id).Data1 = 0;
  (this->m_material_backface_id).Data2 = 0;
  (this->m_material_backface_id).Data3 = 0;
  (this->m_material_backface_id).Data4[0] = '\0';
  (this->m_material_backface_id).Data4[1] = '\0';
  (this->m_material_backface_id).Data4[2] = '\0';
  (this->m_material_backface_id).Data4[3] = '\0';
  (this->m_material_backface_id).Data4[4] = '\0';
  (this->m_material_backface_id).Data4[5] = '\0';
  (this->m_material_backface_id).Data4[6] = '\0';
  (this->m_material_backface_id).Data4[7] = '\0';
  (this->m_material_id).Data1 = 0;
  (this->m_material_id).Data2 = 0;
  (this->m_material_id).Data3 = 0;
  (this->m_material_id).Data4[0] = '\0';
  (this->m_material_id).Data4[1] = '\0';
  (this->m_material_id).Data4[2] = '\0';
  (this->m_material_id).Data4[3] = '\0';
  (this->m_material_id).Data4[4] = '\0';
  (this->m_material_id).Data4[5] = '\0';
  (this->m_material_id).Data4[6] = '\0';
  (this->m_material_id).Data4[7] = '\0';
  (this->m_plugin_id).Data1 = 0;
  (this->m_plugin_id).Data2 = 0;
  (this->m_plugin_id).Data3 = 0;
  (this->m_plugin_id).Data4[0] = '\0';
  (this->m_plugin_id).Data4[1] = '\0';
  (this->m_plugin_id).Data4[2] = '\0';
  (this->m_plugin_id).Data4[3] = '\0';
  (this->m_plugin_id).Data4[4] = '\0';
  (this->m_plugin_id).Data4[5] = '\0';
  (this->m_plugin_id).Data4[6] = '\0';
  (this->m_plugin_id).Data4[7] = '\0';
  this->m_material_source = '\0';
  this->m_reserved1 = '\0';
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_material_index = -1;
  this->m_material_backface_index = -1;
  local_34 = 0;
  local_38 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_34,&local_38);
  if (!bVar1) {
    return false;
  }
  if ((local_34 == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_plugin_id), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_material_id);
    local_30._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad50;
    local_30.m_a = (ON_MappingChannel *)0x0;
    local_30.m_count = 0;
    local_30.m_capacity = 0;
    if (!bVar1) goto LAB_004f930a;
    bVar1 = ON_BinaryArchive::ReadArray(archive,&local_30);
  }
  else {
LAB_004f930a:
    local_30.m_count = 0;
    local_30.m_capacity = 0;
    local_30.m_a = (ON_MappingChannel *)0x0;
    local_30._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad50;
    bVar1 = false;
  }
  if (0 < local_38) {
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_material_backface_id);
      local_3c = (uint)this->m_material_source;
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__INT32 *)&local_3c), bVar1)) {
        oVar3 = ON::ObjectMaterialSource(local_3c);
        this->m_material_source = (uchar)oVar3;
        bVar1 = true;
        goto LAB_004f9356;
      }
    }
    bVar1 = false;
  }
LAB_004f9356:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  ON_SimpleArray<ON_MappingChannel>::~ON_SimpleArray(&local_30);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_MaterialRef::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (rc)
  {
    rc = (1 == major_version);

    if (rc) rc = archive.ReadUuid( m_plugin_id );
    if (rc) rc = archive.ReadUuid( m_material_id );

    // 23 May 2006 Dale lear
    //   m_mapping_channels[] was removed from ON_MaterialRef.
    //   To keep from breaking the file format, I need to
    //   write a zero as the array length.
    ON_SimpleArray<ON_MappingChannel> obsolete_mapping_channels;
    if (rc) rc = archive.ReadArray( obsolete_mapping_channels );

    if ( minor_version >= 1 )
    {
      if (rc) rc = archive.ReadUuid( m_material_backface_id );
      int i = m_material_source;
      if (rc) rc = archive.ReadInt( &i );
      if (rc) m_material_source = (unsigned char)ON::ObjectMaterialSource(i);
    }

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}